

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  OPJ_UINT32 *pOVar1;
  opj_flag_t *flagsp;
  float fVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  long *plVar7;
  int *piVar8;
  opj_event_mgr_t *p_event_mgr;
  opj_mutex_t *mutex;
  opj_mqc_state_t *poVar9;
  byte *pbVar10;
  float *pfVar11;
  bool bVar12;
  OPJ_BOOL OVar13;
  uint uVar14;
  OPJ_INT32 *data;
  void *__s;
  opj_t1_t *t1;
  OPJ_BYTE *pOVar15;
  uint *puVar16;
  uint *puVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int *piVar24;
  uint uVar25;
  opj_flag_t oVar26;
  ulong uVar27;
  float *pfVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint *puVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  opj_mqc_state_t **ppoVar38;
  int iVar39;
  int iVar40;
  OPJ_BYTE *pOVar41;
  long lVar42;
  uint uVar43;
  OPJ_INT32 *pOVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint *puVar50;
  OPJ_UINT32 OVar51;
  opj_mqc_t *mqc;
  size_t size;
  uint uVar52;
  OPJ_UINT32 OVar53;
  long lVar54;
  opj_flag_t *flagsp_00;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  uint local_ec;
  OPJ_INT32 *local_88;
  
  plVar7 = *(long **)((long)user_data + 8);
  if (*user_data == 0) {
    size = (ulong)(uint)(*(int *)((long)plVar7 + 0x1c) - *(int *)((long)plVar7 + 0x14)) *
           (ulong)(uint)((int)plVar7[3] - (int)plVar7[2]) * 4;
    __s = opj_aligned_malloc(size);
    plVar7[8] = (long)__s;
    if (__s != (void *)0x0) {
      memset(__s,0,size);
      goto LAB_00124c48;
    }
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                  "Cannot allocate cblk->decoded_data\n");
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    goto LAB_00124f52;
  }
  if ((void *)plVar7[8] != (void *)0x0) {
    opj_aligned_free((void *)plVar7[8]);
    plVar7[8] = 0;
  }
LAB_00124c48:
  iVar4 = *(int *)((long)user_data + 4);
  piVar8 = *(int **)((long)user_data + 0x10);
  lVar18 = *(long *)((long)user_data + 0x18);
  lVar42 = *(long *)((long)user_data + 0x20);
  lVar23 = (ulong)(*(int *)(lVar18 + 0x18) - 1) * 0xc0;
  uVar35 = *(int *)(*(long *)(lVar18 + 0x20) + 8 + lVar23) -
           *(int *)(*(long *)(lVar18 + 0x20) + lVar23);
  if (**(int **)((long)user_data + 0x30) == 0) goto LAB_00124f5b;
  t1 = (opj_t1_t *)opj_tls_get(tls,0);
  if (t1 == (opj_t1_t *)0x0) {
    t1 = (opj_t1_t *)opj_calloc(1,0x118);
    if (t1 != (opj_t1_t *)0x0) {
      t1->encoder = 0;
    }
    opj_tls_set(tls,0,t1,opj_t1_destroy_wrapper);
  }
  t1->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
  iVar39 = *(int *)(lVar42 + 0x328);
  uVar32 = *(uint *)(lVar42 + 0x10);
  p_event_mgr = *(opj_event_mgr_t **)((long)user_data + 0x38);
  mutex = *(opj_mutex_t **)((long)user_data + 0x40);
  iVar40 = *(int *)((long)user_data + 0x48);
  (t1->mqc).lut_ctxno_zc_orient = "" + (uint)(piVar8[4] << 9);
  OVar13 = opj_t1_allocate_buffers
                     (t1,(int)plVar7[3] - (int)plVar7[2],
                      *(int *)((long)plVar7 + 0x1c) - *(int *)((long)plVar7 + 0x14));
  if (OVar13 != 0) {
    uVar47 = iVar39 + (int)plVar7[4];
    uVar33 = (ulong)uVar47;
    if ((int)uVar47 < 0x1f) {
      opj_mqc_resetstates(&t1->mqc);
      uVar52 = 0;
      opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
      opj_mqc_setstate(&t1->mqc,0x11,0,3);
      opj_mqc_setstate(&t1->mqc,0,0,4);
      uVar47 = *(uint *)(plVar7 + 7);
      uVar27 = (ulong)uVar47;
      if (uVar27 < 2) {
        if (t1->mustuse_cblkdatabuffer != 0) {
          if (uVar47 != 0) goto LAB_00124e1f;
          uVar52 = 0;
          goto LAB_00124e36;
        }
        if (uVar47 == 1) {
          pOVar15 = *(OPJ_BYTE **)plVar7[1];
          goto LAB_00124ec7;
        }
      }
      else {
LAB_00124e1f:
        piVar24 = (int *)(plVar7[1] + 8);
        do {
          uVar52 = uVar52 + *piVar24;
          piVar24 = piVar24 + 4;
          uVar27 = uVar27 - 1;
        } while (uVar27 != 0);
LAB_00124e36:
        uVar49 = uVar52 + 2;
        if (t1->cblkdatabuffersize < uVar49) {
          pOVar15 = (OPJ_BYTE *)opj_realloc(t1->cblkdatabuffer,(ulong)uVar49);
          if (pOVar15 == (OPJ_BYTE *)0x0) goto LAB_00124f52;
          t1->cblkdatabuffer = pOVar15;
          (pOVar15 + uVar52)[0] = '\0';
          (pOVar15 + uVar52)[1] = '\0';
          t1->cblkdatabuffersize = uVar49;
          uVar47 = *(uint *)(plVar7 + 7);
        }
        pOVar15 = t1->cblkdatabuffer;
        if (uVar47 != 0) {
          lVar23 = plVar7[1];
          uVar27 = 0;
          lVar54 = 8;
          uVar47 = 0;
          do {
            memcpy(pOVar15 + uVar47,*(void **)(lVar23 + -8 + lVar54),
                   (ulong)*(uint *)(lVar23 + lVar54));
            lVar23 = plVar7[1];
            uVar47 = uVar47 + *(int *)(lVar23 + lVar54);
            uVar27 = uVar27 + 1;
            lVar54 = lVar54 + 0x10;
          } while (uVar27 < *(uint *)(plVar7 + 7));
        }
LAB_00124ec7:
        if ((OPJ_INT32 *)plVar7[8] == (OPJ_INT32 *)0x0) {
          local_88 = (OPJ_INT32 *)0x0;
        }
        else {
          local_88 = t1->data;
          t1->data = (OPJ_INT32 *)plVar7[8];
        }
        if ((int)plVar7[6] != 0) {
          uVar47 = 2;
          uVar27 = 0;
          local_ec = 0;
          do {
            bVar57 = (uVar32 & 1) == 0;
            lVar23 = *plVar7;
            bVar12 = (int)plVar7[4] + -4 < (int)uVar33;
            bVar55 = 1 < uVar47;
            OVar53 = *(OPJ_UINT32 *)(lVar23 + uVar27 * 0x18);
            if ((bVar55 || bVar57) || bVar12) {
              opj_mqc_init_dec(&t1->mqc,pOVar15 + local_ec,OVar53,2);
            }
            else {
              opj_mqc_raw_init_dec(&t1->mqc,pOVar15 + local_ec,OVar53,2);
            }
            piVar24 = (int *)(lVar23 + uVar27 * 0x18);
            local_ec = local_ec + *piVar24;
            if ((0 < (int)uVar33) && (piVar24[2] != 0)) {
              uVar52 = 0;
              do {
                uVar49 = (uint)uVar33;
                if (uVar47 == 2) {
                  opj_t1_dec_clnpass(t1,uVar49,uVar32);
                }
                else {
                  bVar19 = (byte)uVar33;
                  if (uVar47 == 1) {
                    if ((bVar55 || bVar57) || bVar12) {
                      uVar25 = t1->w;
                      uVar33 = (ulong)uVar25;
                      uVar48 = t1->h;
                      puVar17 = (uint *)t1->data;
                      if (uVar48 == 0x40 && uVar25 == 0x40) {
                        puVar34 = t1->flags + 0x43;
                        ppoVar38 = (t1->mqc).curctx;
                        uVar25 = (t1->mqc).c;
                        uVar48 = (t1->mqc).a;
                        OVar53 = (t1->mqc).ct;
                        uVar31 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                        uVar20 = -uVar31;
                        uVar43 = 0;
                        do {
                          iVar39 = 0;
                          do {
                            puVar50 = puVar34;
                            puVar16 = puVar17;
                            uVar14 = *puVar50;
                            if (uVar14 != 0) {
                              if ((uVar14 & 0x200010) == 0x10) {
                                uVar37 = 0xf - ((uVar14 & 0x1ef) == 0);
                                if ((uVar14 >> 0x14 & 1) != 0) {
                                  uVar37 = 0x10;
                                }
                                ppoVar38 = (t1->mqc).ctxs + uVar37;
                                poVar9 = *ppoVar38;
                                uVar37 = poVar9->qeval;
                                uVar29 = uVar48 - uVar37;
                                if (uVar25 >> 0x10 < uVar37) {
                                  uVar22 = poVar9->mps;
                                  *ppoVar38 = (&poVar9->nmps)[uVar37 <= uVar29];
                                  uVar48 = uVar37;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar41 = (t1->mqc).bp;
                                      bVar19 = pOVar41[1];
                                      if (*pOVar41 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_0012519a;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar41 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_0012519a:
                                    uVar48 = uVar48 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar36 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar37) {
                                    uVar36 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar37 * -0x10000;
                                  uVar48 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar36 = poVar9->mps;
                                  }
                                  else {
                                    uVar22 = poVar9->mps;
                                    *ppoVar38 = (&poVar9->nmps)[uVar29 < uVar37];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar41 = (t1->mqc).bp;
                                        bVar19 = pOVar41[1];
                                        if (*pOVar41 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012521f;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012521f:
                                      uVar48 = uVar48 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar36 = (uint)(uVar22 == 0);
                                    if (uVar37 <= uVar29) {
                                      uVar36 = uVar22;
                                    }
                                  }
                                }
                                uVar37 = uVar31;
                                if (uVar36 == *puVar16 >> 0x1f) {
                                  uVar37 = uVar20;
                                }
                                *puVar16 = uVar37 + *puVar16;
                                uVar14 = uVar14 | 0x100000;
                              }
                              if ((uVar14 & 0x1000080) == 0x80) {
                                uVar33 = (ulong)(0xf - ((uVar14 & 0xf78) == 0));
                                if ((uVar14 >> 0x17 & 1) != 0) {
                                  uVar33 = 0x10;
                                }
                                ppoVar38 = (t1->mqc).ctxs + uVar33;
                                poVar9 = *ppoVar38;
                                uVar37 = poVar9->qeval;
                                uVar29 = uVar48 - uVar37;
                                if (uVar25 >> 0x10 < uVar37) {
                                  uVar22 = poVar9->mps;
                                  *ppoVar38 = (&poVar9->nmps)[uVar37 <= uVar29];
                                  uVar48 = uVar37;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar41 = (t1->mqc).bp;
                                      bVar19 = pOVar41[1];
                                      if (*pOVar41 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_00125320;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar41 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_00125320:
                                    uVar48 = uVar48 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar36 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar37) {
                                    uVar36 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar37 * -0x10000;
                                  uVar48 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar36 = poVar9->mps;
                                  }
                                  else {
                                    uVar22 = poVar9->mps;
                                    *ppoVar38 = (&poVar9->nmps)[uVar29 < uVar37];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar41 = (t1->mqc).bp;
                                        bVar19 = pOVar41[1];
                                        if (*pOVar41 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_001253a5;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_001253a5:
                                      uVar48 = uVar48 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar36 = (uint)(uVar22 == 0);
                                    if (uVar37 <= uVar29) {
                                      uVar36 = uVar22;
                                    }
                                  }
                                }
                                uVar37 = uVar31;
                                if (uVar36 == puVar16[0x40] >> 0x1f) {
                                  uVar37 = uVar20;
                                }
                                puVar16[0x40] = uVar37 + puVar16[0x40];
                                uVar14 = uVar14 | 0x800000;
                              }
                              if ((uVar14 & 0x8000400) == 0x400) {
                                uVar33 = (ulong)(0xf - ((uVar14 & 0x7bc0) == 0));
                                if ((uVar14 >> 0x1a & 1) != 0) {
                                  uVar33 = 0x10;
                                }
                                ppoVar38 = (t1->mqc).ctxs + uVar33;
                                poVar9 = *ppoVar38;
                                uVar37 = poVar9->qeval;
                                uVar29 = uVar48 - uVar37;
                                if (uVar25 >> 0x10 < uVar37) {
                                  uVar22 = poVar9->mps;
                                  *ppoVar38 = (&poVar9->nmps)[uVar37 <= uVar29];
                                  uVar48 = uVar37;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar41 = (t1->mqc).bp;
                                      bVar19 = pOVar41[1];
                                      if (*pOVar41 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_001254ae;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar41 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_001254ae:
                                    uVar48 = uVar48 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar36 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar37) {
                                    uVar36 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar37 * -0x10000;
                                  uVar48 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar36 = poVar9->mps;
                                  }
                                  else {
                                    uVar22 = poVar9->mps;
                                    *ppoVar38 = (&poVar9->nmps)[uVar29 < uVar37];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar41 = (t1->mqc).bp;
                                        bVar19 = pOVar41[1];
                                        if (*pOVar41 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_00125533;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_00125533:
                                      uVar48 = uVar48 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar36 = (uint)(uVar22 == 0);
                                    if (uVar37 <= uVar29) {
                                      uVar36 = uVar22;
                                    }
                                  }
                                }
                                uVar37 = uVar31;
                                if (uVar36 == puVar16[0x80] >> 0x1f) {
                                  uVar37 = uVar20;
                                }
                                puVar16[0x80] = uVar37 + puVar16[0x80];
                                uVar14 = uVar14 | 0x4000000;
                              }
                              if ((uVar14 & 0x40002000) == 0x2000) {
                                uVar33 = (ulong)(0xf - ((uVar14 & 0x3de00) == 0));
                                if ((uVar14 >> 0x1d & 1) != 0) {
                                  uVar33 = 0x10;
                                }
                                ppoVar38 = (t1->mqc).ctxs + uVar33;
                                poVar9 = *ppoVar38;
                                uVar37 = poVar9->qeval;
                                uVar29 = uVar48 - uVar37;
                                if (uVar25 >> 0x10 < uVar37) {
                                  uVar22 = poVar9->mps;
                                  *ppoVar38 = (&poVar9->nmps)[uVar37 <= uVar29];
                                  uVar48 = uVar37;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar41 = (t1->mqc).bp;
                                      bVar19 = pOVar41[1];
                                      if (*pOVar41 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_0012563c;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (t1->mqc).bp = pOVar41 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_0012563c:
                                    uVar48 = uVar48 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar48 < 0x8000);
                                  uVar36 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar37) {
                                    uVar36 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar37 * -0x10000;
                                  uVar48 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar36 = poVar9->mps;
                                  }
                                  else {
                                    uVar22 = poVar9->mps;
                                    *ppoVar38 = (&poVar9->nmps)[uVar29 < uVar37];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar41 = (t1->mqc).bp;
                                        bVar19 = pOVar41[1];
                                        if (*pOVar41 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_001256c1;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_001256c1:
                                      uVar48 = uVar48 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar48 < 0x8000);
                                    uVar36 = (uint)(uVar22 == 0);
                                    if (uVar37 <= uVar29) {
                                      uVar36 = uVar22;
                                    }
                                  }
                                }
                                uVar37 = uVar31;
                                if (uVar36 == puVar16[0xc0] >> 0x1f) {
                                  uVar37 = uVar20;
                                }
                                puVar16[0xc0] = uVar37 + puVar16[0xc0];
                                uVar14 = uVar14 | 0x20000000;
                              }
                              *puVar50 = uVar14;
                            }
                            iVar39 = iVar39 + 1;
                            puVar17 = puVar16 + 1;
                            puVar34 = puVar50 + 1;
                          } while (iVar39 != 0x40);
                          puVar17 = puVar16 + 0xc1;
                          puVar34 = puVar50 + 3;
                          bVar56 = uVar43 < 0x3c;
                          uVar43 = uVar43 + 4;
                        } while (bVar56);
                        (t1->mqc).curctx = ppoVar38;
                        (t1->mqc).c = uVar25;
                        (t1->mqc).a = uVar48;
                        (t1->mqc).ct = OVar53;
                      }
                      else {
                        puVar34 = t1->flags + (uVar25 + 3);
                        ppoVar38 = (t1->mqc).curctx;
                        uVar43 = (t1->mqc).c;
                        uVar45 = (ulong)uVar43;
                        uVar20 = (t1->mqc).a;
                        OVar53 = (t1->mqc).ct;
                        uVar14 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                        uVar31 = 0;
                        if (3 < uVar48) {
                          uVar29 = -uVar14;
                          uVar37 = uVar25 * 3;
                          uVar31 = 0;
                          do {
                            if (uVar33 != 0) {
                              uVar48 = 0;
                              do {
                                uVar43 = *puVar34;
                                if (uVar43 != 0) {
                                  if ((uVar43 & 0x200010) == 0x10) {
                                    uVar46 = (ulong)(0xf - ((uVar43 & 0x1ef) == 0));
                                    if ((uVar43 >> 0x14 & 1) != 0) {
                                      uVar46 = 0x10;
                                    }
                                    ppoVar38 = (t1->mqc).ctxs + uVar46;
                                    poVar9 = *ppoVar38;
                                    uVar22 = poVar9->qeval;
                                    uVar36 = uVar20 - uVar22;
                                    if ((uint)(uVar45 >> 0x10) < uVar22) {
                                      uVar5 = poVar9->mps;
                                      *ppoVar38 = (&poVar9->nmps)[uVar22 <= uVar36];
                                      uVar20 = uVar22;
                                      do {
                                        iVar39 = (int)uVar45;
                                        if (OVar53 == 0) {
                                          pOVar41 = (t1->mqc).bp;
                                          bVar19 = pOVar41[1];
                                          if (*pOVar41 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_00126118;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_00126118:
                                        uVar20 = uVar20 * 2;
                                        uVar45 = (ulong)(uint)(iVar39 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar5 == 0);
                                      if (uVar36 < uVar22) {
                                        uVar21 = uVar5;
                                      }
                                    }
                                    else {
                                      uVar45 = (ulong)((int)uVar45 + uVar22 * -0x10000);
                                      uVar20 = uVar36;
                                      if ((short)uVar36 < 0) {
                                        uVar21 = poVar9->mps;
                                      }
                                      else {
                                        uVar5 = poVar9->mps;
                                        *ppoVar38 = (&poVar9->nmps)[uVar36 < uVar22];
                                        do {
                                          iVar39 = (int)uVar45;
                                          if (OVar53 == 0) {
                                            pOVar41 = (t1->mqc).bp;
                                            bVar19 = pOVar41[1];
                                            if (*pOVar41 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar41 + 1;
                                                iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_0012619f;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_0012619f:
                                          uVar20 = uVar20 * 2;
                                          uVar45 = (ulong)(uint)(iVar39 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar5 == 0);
                                        if (uVar22 <= uVar36) {
                                          uVar21 = uVar5;
                                        }
                                      }
                                    }
                                    uVar22 = uVar14;
                                    if (uVar21 == *puVar17 >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    *puVar17 = uVar22 + *puVar17;
                                    uVar43 = uVar43 | 0x100000;
                                  }
                                  if ((uVar43 & 0x1000080) == 0x80) {
                                    uVar46 = (ulong)(0xf - ((uVar43 & 0xf78) == 0));
                                    if ((uVar43 >> 0x17 & 1) != 0) {
                                      uVar46 = 0x10;
                                    }
                                    ppoVar38 = (t1->mqc).ctxs + uVar46;
                                    poVar9 = *ppoVar38;
                                    uVar22 = poVar9->qeval;
                                    uVar36 = uVar20 - uVar22;
                                    if ((uint)(uVar45 >> 0x10) < uVar22) {
                                      uVar5 = poVar9->mps;
                                      *ppoVar38 = (&poVar9->nmps)[uVar22 <= uVar36];
                                      uVar20 = uVar22;
                                      do {
                                        iVar39 = (int)uVar45;
                                        if (OVar53 == 0) {
                                          pOVar41 = (t1->mqc).bp;
                                          bVar19 = pOVar41[1];
                                          if (*pOVar41 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_001262ab;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_001262ab:
                                        uVar20 = uVar20 * 2;
                                        uVar45 = (ulong)(uint)(iVar39 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar5 == 0);
                                      if (uVar36 < uVar22) {
                                        uVar21 = uVar5;
                                      }
                                    }
                                    else {
                                      uVar45 = (ulong)((int)uVar45 + uVar22 * -0x10000);
                                      uVar20 = uVar36;
                                      if ((short)uVar36 < 0) {
                                        uVar21 = poVar9->mps;
                                      }
                                      else {
                                        uVar5 = poVar9->mps;
                                        *ppoVar38 = (&poVar9->nmps)[uVar36 < uVar22];
                                        do {
                                          iVar39 = (int)uVar45;
                                          if (OVar53 == 0) {
                                            pOVar41 = (t1->mqc).bp;
                                            bVar19 = pOVar41[1];
                                            if (*pOVar41 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar41 + 1;
                                                iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_00126332;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_00126332:
                                          uVar20 = uVar20 * 2;
                                          uVar45 = (ulong)(uint)(iVar39 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar5 == 0);
                                        if (uVar22 <= uVar36) {
                                          uVar21 = uVar5;
                                        }
                                      }
                                    }
                                    uVar22 = uVar14;
                                    if (uVar21 == puVar17[uVar33] >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    puVar17[uVar33] = uVar22 + puVar17[uVar33];
                                    uVar43 = uVar43 | 0x800000;
                                  }
                                  if ((uVar43 & 0x8000400) == 0x400) {
                                    uVar46 = (ulong)(0xf - ((uVar43 & 0x7bc0) == 0));
                                    if ((uVar43 >> 0x1a & 1) != 0) {
                                      uVar46 = 0x10;
                                    }
                                    ppoVar38 = (t1->mqc).ctxs + uVar46;
                                    poVar9 = *ppoVar38;
                                    uVar22 = poVar9->qeval;
                                    uVar36 = uVar20 - uVar22;
                                    if ((uint)(uVar45 >> 0x10) < uVar22) {
                                      uVar5 = poVar9->mps;
                                      *ppoVar38 = (&poVar9->nmps)[uVar22 <= uVar36];
                                      uVar20 = uVar22;
                                      do {
                                        iVar39 = (int)uVar45;
                                        if (OVar53 == 0) {
                                          pOVar41 = (t1->mqc).bp;
                                          bVar19 = pOVar41[1];
                                          if (*pOVar41 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_00126440;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_00126440:
                                        uVar20 = uVar20 * 2;
                                        uVar45 = (ulong)(uint)(iVar39 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar5 == 0);
                                      if (uVar36 < uVar22) {
                                        uVar21 = uVar5;
                                      }
                                    }
                                    else {
                                      uVar45 = (ulong)((int)uVar45 + uVar22 * -0x10000);
                                      uVar20 = uVar36;
                                      if ((short)uVar36 < 0) {
                                        uVar21 = poVar9->mps;
                                      }
                                      else {
                                        uVar5 = poVar9->mps;
                                        *ppoVar38 = (&poVar9->nmps)[uVar36 < uVar22];
                                        do {
                                          iVar39 = (int)uVar45;
                                          if (OVar53 == 0) {
                                            pOVar41 = (t1->mqc).bp;
                                            bVar19 = pOVar41[1];
                                            if (*pOVar41 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar41 + 1;
                                                iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_001264c7;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_001264c7:
                                          uVar20 = uVar20 * 2;
                                          uVar45 = (ulong)(uint)(iVar39 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar5 == 0);
                                        if (uVar22 <= uVar36) {
                                          uVar21 = uVar5;
                                        }
                                      }
                                    }
                                    uVar22 = uVar14;
                                    if (uVar21 == puVar17[uVar25 * 2] >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    puVar17[uVar25 * 2] = uVar22 + puVar17[uVar25 * 2];
                                    uVar43 = uVar43 | 0x4000000;
                                  }
                                  if ((uVar43 & 0x40002000) == 0x2000) {
                                    uVar46 = (ulong)(0xf - ((uVar43 & 0x3de00) == 0));
                                    if ((uVar43 >> 0x1d & 1) != 0) {
                                      uVar46 = 0x10;
                                    }
                                    ppoVar38 = (t1->mqc).ctxs + uVar46;
                                    poVar9 = *ppoVar38;
                                    uVar22 = poVar9->qeval;
                                    uVar36 = uVar20 - uVar22;
                                    if ((uint)(uVar45 >> 0x10) < uVar22) {
                                      uVar5 = poVar9->mps;
                                      *ppoVar38 = (&poVar9->nmps)[uVar22 <= uVar36];
                                      uVar20 = uVar22;
                                      do {
                                        iVar39 = (int)uVar45;
                                        if (OVar53 == 0) {
                                          pOVar41 = (t1->mqc).bp;
                                          bVar19 = pOVar41[1];
                                          if (*pOVar41 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_001265df;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_001265df:
                                        uVar20 = uVar20 * 2;
                                        uVar45 = (ulong)(uint)(iVar39 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar5 == 0);
                                      if (uVar36 < uVar22) {
                                        uVar21 = uVar5;
                                      }
                                    }
                                    else {
                                      uVar45 = (ulong)((int)uVar45 + uVar22 * -0x10000);
                                      uVar20 = uVar36;
                                      if ((short)uVar36 < 0) {
                                        uVar21 = poVar9->mps;
                                      }
                                      else {
                                        uVar5 = poVar9->mps;
                                        *ppoVar38 = (&poVar9->nmps)[uVar36 < uVar22];
                                        do {
                                          iVar39 = (int)uVar45;
                                          if (OVar53 == 0) {
                                            pOVar41 = (t1->mqc).bp;
                                            bVar19 = pOVar41[1];
                                            if (*pOVar41 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (t1->mqc).bp = pOVar41 + 1;
                                                iVar39 = iVar39 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_00126666;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              iVar39 = iVar39 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_00126666:
                                          uVar20 = uVar20 * 2;
                                          uVar45 = (ulong)(uint)(iVar39 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar5 == 0);
                                        if (uVar22 <= uVar36) {
                                          uVar21 = uVar5;
                                        }
                                      }
                                    }
                                    uVar22 = uVar14;
                                    if (uVar21 == puVar17[uVar37] >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    puVar17[uVar37] = uVar22 + puVar17[uVar37];
                                    uVar43 = uVar43 | 0x20000000;
                                  }
                                  *puVar34 = uVar43;
                                }
                                uVar48 = uVar48 + 1;
                                puVar17 = puVar17 + 1;
                                puVar34 = puVar34 + 1;
                              } while (uVar48 != uVar25);
                              uVar48 = t1->h;
                            }
                            uVar43 = (uint)uVar45;
                            uVar31 = uVar31 + 4;
                            puVar17 = puVar17 + uVar37;
                            puVar34 = puVar34 + 2;
                          } while (uVar31 < (uVar48 & 0xfffffffc));
                        }
                        (t1->mqc).curctx = ppoVar38;
                        (t1->mqc).c = uVar43;
                        (t1->mqc).a = uVar20;
                        (t1->mqc).ct = OVar53;
                        if ((uVar33 != 0) && (uVar31 < uVar48)) {
                          uVar20 = 0;
                          uVar43 = uVar48;
                          do {
                            bVar56 = uVar43 != uVar31;
                            uVar43 = uVar31;
                            if (bVar56) {
                              uVar37 = *puVar34;
                              uVar33 = 0;
                              do {
                                bVar19 = (char)uVar33 * '\x03';
                                if ((0x200010 << (bVar19 & 0x1f) & uVar37) ==
                                    0x10 << (bVar19 & 0x1f)) {
                                  uVar37 = uVar37 >> (bVar19 & 0x1f);
                                  iVar39 = 0xf - (uint)((uVar37 & 0x1ef) == 0);
                                  if ((uVar37 >> 0x14 & 1) != 0) {
                                    iVar39 = 0x10;
                                  }
                                  ppoVar38 = (opj_mqc_state_t **)
                                             ((long)(t1->mqc).ctxs + (ulong)(uint)(iVar39 << 3));
                                  (t1->mqc).curctx = ppoVar38;
                                  puVar16 = *(uint **)((long)(t1->mqc).ctxs +
                                                      (ulong)(uint)(iVar39 << 3));
                                  uVar48 = *puVar16;
                                  uVar43 = (t1->mqc).c;
                                  uVar37 = (t1->mqc).a - uVar48;
                                  (t1->mqc).a = uVar37;
                                  if (uVar43 >> 0x10 < uVar48) {
                                    uVar22 = puVar16[1];
                                    (t1->mqc).a = uVar48;
                                    *ppoVar38 = *(opj_mqc_state_t **)
                                                 (puVar16 + (ulong)(uVar48 <= uVar37) * 2 + 2);
                                    OVar53 = (t1->mqc).ct;
                                    uVar29 = uVar48;
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar41 = (t1->mqc).bp;
                                        bVar3 = pOVar41[1];
                                        if (*pOVar41 == 0xff) {
                                          if (bVar3 < 0x90) {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            uVar43 = uVar43 + (uint)bVar3 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012683e;
                                          }
                                          uVar43 = uVar43 + 0xff00;
                                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (t1->mqc).bp = pOVar41 + 1;
                                          uVar43 = uVar43 + (uint)bVar3 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012683e:
                                      uVar29 = uVar29 * 2;
                                      (t1->mqc).a = uVar29;
                                      uVar43 = uVar43 * 2;
                                      (t1->mqc).c = uVar43;
                                      OVar53 = OVar53 - 1;
                                      (t1->mqc).ct = OVar53;
                                    } while (uVar29 < 0x8000);
                                    uVar29 = (uint)(uVar22 == 0);
                                    if (uVar37 < uVar48) {
                                      uVar29 = uVar22;
                                    }
                                  }
                                  else {
                                    OVar53 = uVar43 + uVar48 * -0x10000;
                                    (t1->mqc).c = OVar53;
                                    if ((short)uVar37 < 0) {
                                      uVar29 = puVar16[1];
                                    }
                                    else {
                                      uVar43 = puVar16[1];
                                      *ppoVar38 = *(opj_mqc_state_t **)
                                                   (puVar16 + (ulong)(uVar37 < uVar48) * 2 + 2);
                                      OVar51 = (t1->mqc).ct;
                                      uVar29 = uVar37;
                                      do {
                                        if (OVar51 == 0) {
                                          pOVar41 = (t1->mqc).bp;
                                          bVar3 = pOVar41[1];
                                          if (*pOVar41 == 0xff) {
                                            if (bVar3 < 0x90) {
                                              (t1->mqc).bp = pOVar41 + 1;
                                              OVar53 = OVar53 + (uint)bVar3 * 0x200;
                                              OVar51 = 7;
                                              goto LAB_001268dd;
                                            }
                                            OVar53 = OVar53 + 0xff00;
                                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (t1->mqc).bp = pOVar41 + 1;
                                            OVar53 = OVar53 + (uint)bVar3 * 0x100;
                                          }
                                          OVar51 = 8;
                                        }
LAB_001268dd:
                                        uVar29 = uVar29 * 2;
                                        (t1->mqc).a = uVar29;
                                        OVar53 = OVar53 * 2;
                                        (t1->mqc).c = OVar53;
                                        OVar51 = OVar51 - 1;
                                        (t1->mqc).ct = OVar51;
                                      } while (uVar29 < 0x8000);
                                      uVar29 = (uint)(uVar43 == 0);
                                      if (uVar48 <= uVar37) {
                                        uVar29 = uVar43;
                                      }
                                    }
                                  }
                                  uVar43 = uVar25 * (int)uVar33;
                                  uVar48 = uVar14;
                                  if (uVar29 == puVar17[uVar43] >> 0x1f) {
                                    uVar48 = -uVar14;
                                  }
                                  puVar17[uVar43] = uVar48 + puVar17[uVar43];
                                  uVar37 = 0x100000 << (bVar19 & 0x1f) | *puVar34;
                                  *puVar34 = uVar37;
                                  uVar48 = t1->h;
                                }
                                uVar33 = uVar33 + 1;
                                uVar43 = uVar48;
                              } while (uVar33 < uVar48 - uVar31);
                            }
                            uVar20 = uVar20 + 1;
                            puVar17 = puVar17 + 1;
                            puVar34 = puVar34 + 1;
                          } while (uVar20 != uVar25);
                        }
                      }
                    }
                    else {
                      puVar17 = (uint *)t1->data;
                      uVar25 = t1->w;
                      uVar33 = (ulong)uVar25;
                      puVar34 = t1->flags + (uVar25 + 3);
                      uVar43 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                      uVar48 = t1->h;
                      uVar20 = 0;
                      if (3 < uVar48) {
                        uVar14 = -uVar43;
                        uVar31 = uVar25 * 3;
                        uVar20 = 0;
                        do {
                          uVar45 = uVar33;
                          if (uVar25 != 0) {
                            do {
                              uVar48 = *puVar34;
                              if (uVar48 != 0) {
                                if ((uVar48 & 0x200010) == 0x10) {
                                  uVar48 = (t1->mqc).c;
                                  OVar53 = (t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar10 = (t1->mqc).bp;
                                    bVar56 = uVar48 == 0xff;
                                    uVar48 = (uint)*pbVar10;
                                    if (bVar56) {
                                      if (*pbVar10 < 0x90) {
                                        (t1->mqc).c = uVar48;
                                        (t1->mqc).bp = pbVar10 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar48 = 0xff;
                                      }
                                    }
                                    else {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (t1->mqc).ct = OVar53 - 1;
                                  uVar37 = uVar14;
                                  if ((uint)((uVar48 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      *puVar17 >> 0x1f) {
                                    uVar37 = uVar43;
                                  }
                                  *puVar17 = uVar37 + *puVar17;
                                  uVar48 = *puVar34 | 0x100000;
                                  *puVar34 = uVar48;
                                }
                                if ((uVar48 & 0x1000080) == 0x80) {
                                  uVar48 = (t1->mqc).c;
                                  OVar53 = (t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar10 = (t1->mqc).bp;
                                    bVar56 = uVar48 == 0xff;
                                    uVar48 = (uint)*pbVar10;
                                    if (bVar56) {
                                      if (*pbVar10 < 0x90) {
                                        (t1->mqc).c = uVar48;
                                        (t1->mqc).bp = pbVar10 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar48 = 0xff;
                                      }
                                    }
                                    else {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (t1->mqc).ct = OVar53 - 1;
                                  uVar37 = uVar14;
                                  if ((uint)((uVar48 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      puVar17[uVar33] >> 0x1f) {
                                    uVar37 = uVar43;
                                  }
                                  puVar17[uVar33] = uVar37 + puVar17[uVar33];
                                  uVar48 = *puVar34 | 0x800000;
                                  *puVar34 = uVar48;
                                }
                                if ((uVar48 & 0x8000400) == 0x400) {
                                  uVar48 = (t1->mqc).c;
                                  OVar53 = (t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar10 = (t1->mqc).bp;
                                    bVar56 = uVar48 == 0xff;
                                    uVar48 = (uint)*pbVar10;
                                    if (bVar56) {
                                      if (*pbVar10 < 0x90) {
                                        (t1->mqc).c = uVar48;
                                        (t1->mqc).bp = pbVar10 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar48 = 0xff;
                                      }
                                    }
                                    else {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (t1->mqc).ct = OVar53 - 1;
                                  uVar37 = uVar14;
                                  if ((uint)((uVar48 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      puVar17[uVar25 * 2] >> 0x1f) {
                                    uVar37 = uVar43;
                                  }
                                  puVar17[uVar25 * 2] = uVar37 + puVar17[uVar25 * 2];
                                  uVar48 = *puVar34 | 0x4000000;
                                  *puVar34 = uVar48;
                                }
                                if ((uVar48 & 0x40002000) == 0x2000) {
                                  uVar48 = (t1->mqc).c;
                                  OVar53 = (t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar10 = (t1->mqc).bp;
                                    bVar56 = uVar48 == 0xff;
                                    uVar48 = (uint)*pbVar10;
                                    if (bVar56) {
                                      if (*pbVar10 < 0x90) {
                                        (t1->mqc).c = uVar48;
                                        (t1->mqc).bp = pbVar10 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar48 = 0xff;
                                      }
                                    }
                                    else {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (t1->mqc).ct = OVar53 - 1;
                                  uVar37 = uVar14;
                                  if ((uint)((uVar48 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      puVar17[uVar31] >> 0x1f) {
                                    uVar37 = uVar43;
                                  }
                                  puVar17[uVar31] = uVar37 + puVar17[uVar31];
                                  *(byte *)((long)puVar34 + 3) = *(byte *)((long)puVar34 + 3) | 0x20
                                  ;
                                }
                              }
                              puVar34 = puVar34 + 1;
                              puVar17 = puVar17 + 1;
                              uVar48 = (int)uVar45 - 1;
                              uVar45 = (ulong)uVar48;
                            } while (uVar48 != 0);
                            uVar48 = t1->h;
                          }
                          uVar20 = uVar20 + 4;
                          puVar34 = puVar34 + 2;
                          puVar17 = puVar17 + uVar31;
                        } while (uVar20 < (uVar48 & 0xfffffffc));
                      }
                      if (uVar25 != 0 && uVar20 < uVar48) {
                        uVar14 = 0;
                        uVar31 = uVar48;
                        do {
                          bVar56 = uVar31 != uVar20;
                          uVar31 = uVar20;
                          if (bVar56) {
                            uVar37 = *puVar34;
                            uVar33 = 0;
                            bVar19 = 0;
                            uVar45 = 0;
                            do {
                              if ((0x200010 << (bVar19 & 0x1f) & uVar37) == 0x10 << (bVar19 & 0x1f))
                              {
                                uVar48 = (t1->mqc).c;
                                OVar53 = (t1->mqc).ct;
                                if (OVar53 == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar56 = uVar48 == 0xff;
                                  uVar48 = (uint)*pbVar10;
                                  if (bVar56) {
                                    if (*pbVar10 < 0x90) {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 7;
                                    }
                                    else {
                                      (t1->mqc).c = 0xff;
                                      OVar53 = 8;
                                      uVar48 = 0xff;
                                    }
                                  }
                                  else {
                                    (t1->mqc).c = uVar48;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar53 = 8;
                                  }
                                }
                                (t1->mqc).ct = OVar53 - 1;
                                uVar31 = -uVar43;
                                if ((uint)((uVar48 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                    puVar17[uVar33] >> 0x1f) {
                                  uVar31 = uVar43;
                                }
                                puVar17[uVar33] = uVar31 + puVar17[uVar33];
                                uVar37 = 0x100000 << (bVar19 & 0x1f) | *puVar34;
                                *puVar34 = uVar37;
                                uVar48 = t1->h;
                              }
                              uVar45 = uVar45 + 1;
                              bVar19 = bVar19 + 3;
                              uVar33 = (ulong)((int)uVar33 + uVar25);
                              uVar31 = uVar48;
                            } while (uVar45 < uVar48 - uVar20);
                          }
                          uVar14 = uVar14 + 1;
                          puVar34 = puVar34 + 1;
                          puVar17 = puVar17 + 1;
                        } while (uVar14 != uVar25);
                      }
                    }
                  }
                  else if ((bVar55 || bVar57) || bVar12) {
                    opj_t1_dec_sigpass_mqc(t1,uVar49,uVar32);
                  }
                  else {
                    pOVar44 = t1->data;
                    uVar25 = t1->w;
                    flagsp_00 = t1->flags + (uVar25 + 3);
                    uVar20 = (uint)(1 << (bVar19 & 0x1f)) >> 1 | 1 << (uVar49 & 0x1f);
                    uVar48 = t1->h;
                    uVar43 = 0;
                    if (3 < uVar48) {
                      uVar43 = 0;
                      do {
                        if (uVar25 != 0) {
                          lVar23 = 0;
                          uVar33 = (ulong)uVar25;
                          do {
                            if (*(int *)((long)flagsp_00 + lVar23) != 0) {
                              flagsp = (opj_flag_t *)((long)flagsp_00 + lVar23);
                              opj_t1_dec_sigpass_step_raw
                                        (t1,flagsp,(OPJ_INT32 *)((long)pOVar44 + lVar23),uVar20,
                                         uVar32 & 8,0);
                              uVar48 = *flagsp;
                              if ((uVar48 & 0xf78) != 0 && (uVar48 & 0x1000080) == 0) {
                                uVar48 = (t1->mqc).c;
                                OVar53 = (t1->mqc).ct;
                                if (OVar53 == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar56 = uVar48 == 0xff;
                                  uVar48 = (uint)*pbVar10;
                                  if (bVar56) {
                                    if (*pbVar10 < 0x90) {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 7;
                                    }
                                    else {
                                      (t1->mqc).c = 0xff;
                                      OVar53 = 8;
                                      uVar48 = 0xff;
                                    }
                                  }
                                  else {
                                    (t1->mqc).c = uVar48;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar53 = 8;
                                  }
                                }
                                uVar31 = OVar53 - 1;
                                (t1->mqc).ct = uVar31;
                                if ((uVar48 >> (uVar31 & 0x1f) & 1) == 0) {
                                  oVar26 = *flagsp;
                                }
                                else {
                                  if (uVar31 == 0) {
                                    pbVar10 = (t1->mqc).bp;
                                    bVar56 = uVar48 == 0xff;
                                    uVar48 = (uint)*pbVar10;
                                    if (bVar56) {
                                      if (*pbVar10 < 0x90) {
                                        (t1->mqc).c = uVar48;
                                        (t1->mqc).bp = pbVar10 + 1;
                                        uVar31 = 7;
                                      }
                                      else {
                                        (t1->mqc).c = 0xff;
                                        uVar31 = 8;
                                        uVar48 = 0xff;
                                      }
                                    }
                                    else {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      uVar31 = 8;
                                    }
                                  }
                                  (t1->mqc).ct = uVar31 - 1;
                                  bVar56 = (uVar48 >> (uVar31 - 1 & 0x1f) & 1) != 0;
                                  uVar48 = -uVar20;
                                  if (!bVar56) {
                                    uVar48 = uVar20;
                                  }
                                  *(uint *)((long)pOVar44 + lVar23 + (ulong)uVar25 * 4) = uVar48;
                                  pbVar10 = (byte *)((long)flagsp_00 + lVar23 + -3);
                                  *pbVar10 = *pbVar10 | 1;
                                  oVar26 = (uint)bVar56 << 0x16 |
                                           *(uint *)((long)flagsp_00 + lVar23) | 0x80;
                                  pbVar10 = (byte *)((long)flagsp_00 + lVar23 + 4);
                                  *pbVar10 = *pbVar10 | 0x40;
                                }
                                uVar48 = oVar26 | 0x1000000;
                                *flagsp = uVar48;
                              }
                              if ((uVar48 & 0x7bc0) != 0 && (uVar48 & 0x8000400) == 0) {
                                uVar48 = (t1->mqc).c;
                                OVar53 = (t1->mqc).ct;
                                if (OVar53 == 0) {
                                  pbVar10 = (t1->mqc).bp;
                                  bVar56 = uVar48 == 0xff;
                                  uVar48 = (uint)*pbVar10;
                                  if (bVar56) {
                                    if (*pbVar10 < 0x90) {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      OVar53 = 7;
                                    }
                                    else {
                                      (t1->mqc).c = 0xff;
                                      OVar53 = 8;
                                      uVar48 = 0xff;
                                    }
                                  }
                                  else {
                                    (t1->mqc).c = uVar48;
                                    (t1->mqc).bp = pbVar10 + 1;
                                    OVar53 = 8;
                                  }
                                }
                                uVar31 = OVar53 - 1;
                                (t1->mqc).ct = uVar31;
                                if ((uVar48 >> (uVar31 & 0x1f) & 1) == 0) {
                                  oVar26 = *flagsp;
                                }
                                else {
                                  if (uVar31 == 0) {
                                    pbVar10 = (t1->mqc).bp;
                                    bVar56 = uVar48 == 0xff;
                                    uVar48 = (uint)*pbVar10;
                                    if (bVar56) {
                                      if (*pbVar10 < 0x90) {
                                        (t1->mqc).c = uVar48;
                                        (t1->mqc).bp = pbVar10 + 1;
                                        uVar31 = 7;
                                      }
                                      else {
                                        (t1->mqc).c = 0xff;
                                        uVar31 = 8;
                                        uVar48 = 0xff;
                                      }
                                    }
                                    else {
                                      (t1->mqc).c = uVar48;
                                      (t1->mqc).bp = pbVar10 + 1;
                                      uVar31 = 8;
                                    }
                                  }
                                  (t1->mqc).ct = uVar31 - 1;
                                  bVar56 = (uVar48 >> (uVar31 - 1 & 0x1f) & 1) != 0;
                                  uVar48 = -uVar20;
                                  if (!bVar56) {
                                    uVar48 = uVar20;
                                  }
                                  *(uint *)((long)pOVar44 + lVar23 + (ulong)(uVar25 * 2) * 4) =
                                       uVar48;
                                  pbVar10 = (byte *)((long)flagsp_00 + lVar23 + -3);
                                  *pbVar10 = *pbVar10 | 8;
                                  oVar26 = (uint)bVar56 << 0x19 |
                                           *(uint *)((long)flagsp_00 + lVar23) | 0x400;
                                  pbVar10 = (byte *)((long)flagsp_00 + lVar23 + 5);
                                  *pbVar10 = *pbVar10 | 2;
                                }
                                *flagsp = oVar26 | 0x8000000;
                              }
                              opj_t1_dec_sigpass_step_raw
                                        (t1,flagsp,
                                         (OPJ_INT32 *)
                                         ((long)pOVar44 + lVar23 + (ulong)(uVar25 * 3) * 4),uVar20,0
                                         ,3);
                            }
                            lVar23 = lVar23 + 4;
                            uVar48 = (int)uVar33 - 1;
                            uVar33 = (ulong)uVar48;
                          } while (uVar48 != 0);
                          uVar48 = t1->h;
                          flagsp_00 = (opj_flag_t *)((long)flagsp_00 + lVar23);
                          pOVar44 = (OPJ_INT32 *)((long)pOVar44 + lVar23);
                        }
                        uVar43 = uVar43 + 4;
                        flagsp_00 = flagsp_00 + 2;
                        pOVar44 = pOVar44 + uVar25 * 3;
                      } while (uVar43 < (uVar48 & 0xfffffffc));
                    }
                    if (uVar25 != 0 && uVar43 < uVar48) {
                      uVar31 = 0;
                      do {
                        bVar56 = uVar48 != uVar43;
                        uVar48 = uVar43;
                        if (bVar56) {
                          uVar45 = 0;
                          uVar33 = 0;
                          do {
                            opj_t1_dec_sigpass_step_raw
                                      (t1,flagsp_00,pOVar44 + uVar45,uVar20,uVar32 & 8,
                                       (OPJ_UINT32)uVar33);
                            uVar33 = uVar33 + 1;
                            uVar48 = t1->h;
                            uVar45 = (ulong)((int)uVar45 + uVar25);
                          } while (uVar33 < uVar48 - uVar43);
                        }
                        uVar31 = uVar31 + 1;
                        flagsp_00 = flagsp_00 + 1;
                        pOVar44 = pOVar44 + 1;
                      } while (uVar31 != uVar25);
                    }
                  }
                }
                if (((byte)uVar32 >> 1 & ((bVar55 || bVar57) || bVar12)) != 0) {
                  opj_mqc_resetstates(&t1->mqc);
                  opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
                  opj_mqc_setstate(&t1->mqc,0x11,0,3);
                  opj_mqc_setstate(&t1->mqc,0,0,4);
                }
                uVar25 = uVar47 + 1;
                uVar47 = uVar25;
                if (uVar25 == 3) {
                  uVar47 = 0;
                }
                uVar49 = uVar49 - (uVar25 == 3);
                uVar33 = (ulong)uVar49;
                uVar52 = uVar52 + 1;
              } while ((uVar52 < (uint)piVar24[2]) && (0 < (int)uVar49));
            }
            opq_mqc_finish_dec(&t1->mqc);
            uVar27 = uVar27 + 1;
          } while (uVar27 < *(uint *)(plVar7 + 6));
        }
        if (iVar40 != 0) {
          pOVar15 = (t1->mqc).bp;
          pOVar41 = (t1->mqc).end;
          if (pOVar15 + 2 < pOVar41) {
            if (mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(mutex);
              pOVar15 = (t1->mqc).bp;
              pOVar41 = (t1->mqc).end;
            }
            iVar39 = *(int *)&(t1->mqc).start;
            opj_event_msg(p_event_mgr,2,
                          "PTERM check failure: %d remaining bytes in code block (%d used / %d)\n",
                          (ulong)(((int)pOVar41 - (int)pOVar15) - 2),
                          (ulong)(uint)((int)pOVar15 - iVar39),(ulong)(uint)((int)pOVar41 - iVar39))
            ;
            if (mutex != (opj_mutex_t *)0x0) {
LAB_00126b05:
              opj_mutex_unlock(mutex);
            }
          }
          else if (2 < (t1->mqc).end_of_byte_stream_counter) {
            if (mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(mutex);
              opj_event_msg(p_event_mgr,2,"PTERM check failure: %d synthetized 0xFF markers read\n",
                            (ulong)(t1->mqc).end_of_byte_stream_counter);
              goto LAB_00126b05;
            }
            opj_event_msg(p_event_mgr,2,"PTERM check failure: %d synthetized 0xFF markers read\n");
          }
        }
        if (plVar7[8] != 0) {
          t1->data = local_88;
        }
      }
      iVar39 = (int)plVar7[2] - *piVar8;
      if ((piVar8[4] & 1U) != 0) {
        lVar23 = (ulong)(iVar4 - 1) * 0xc0;
        iVar39 = (iVar39 + *(int *)(*(long *)(lVar18 + 0x20) + 8 + lVar23)) -
                 *(int *)(*(long *)(lVar18 + 0x20) + lVar23);
      }
      iVar40 = *(int *)((long)plVar7 + 0x14) - piVar8[1];
      if ((piVar8[4] & 2U) != 0) {
        lVar23 = (ulong)(iVar4 - 1) * 0xc0;
        iVar40 = (iVar40 + *(int *)(*(long *)(lVar18 + 0x20) + 0xc + lVar23)) -
                 *(int *)(*(long *)(lVar18 + 0x20) + 4 + lVar23);
      }
      pfVar11 = (float *)plVar7[8];
      pfVar28 = pfVar11;
      if (pfVar11 == (float *)0x0) {
        pfVar28 = (float *)t1->data;
      }
      uVar32 = t1->w;
      uVar33 = (ulong)uVar32;
      uVar47 = t1->h;
      uVar27 = (ulong)uVar47;
      iVar4 = *(int *)(lVar42 + 0x328);
      if (iVar4 != 0) {
        if (iVar4 < 0x1f) {
          if (uVar27 != 0) {
            uVar52 = 0;
            uVar25 = 0;
            uVar45 = uVar33;
            uVar49 = uVar52;
            do {
              for (; uVar45 != 0; uVar45 = uVar45 - 1) {
                fVar2 = pfVar28[uVar52];
                fVar30 = (float)-(int)fVar2;
                if (0 < (int)fVar2) {
                  fVar30 = fVar2;
                }
                if ((uint)fVar30 >> ((byte)iVar4 & 0x1f) != 0) {
                  fVar30 = (float)((uint)fVar30 >> (*(byte *)(lVar42 + 0x328) & 0x1f));
                  fVar6 = (float)-(int)fVar30;
                  if (-1 < (int)fVar2) {
                    fVar6 = fVar30;
                  }
                  pfVar28[uVar52] = fVar6;
                }
                uVar52 = uVar52 + 1;
              }
              uVar25 = uVar25 + 1;
              uVar52 = uVar49 + uVar32;
              uVar45 = uVar33;
              uVar49 = uVar52;
            } while (uVar25 != uVar47);
          }
        }
        else if (uVar27 != 0) {
          uVar52 = 0;
          uVar25 = 0;
          uVar45 = uVar33;
          uVar49 = uVar52;
          do {
            for (; uVar45 != 0; uVar45 = uVar45 - 1) {
              pfVar28[uVar52] = 0.0;
              uVar52 = uVar52 + 1;
            }
            uVar25 = uVar25 + 1;
            uVar52 = uVar49 + uVar32;
            uVar45 = uVar33;
            uVar49 = uVar52;
          } while (uVar25 != uVar47);
        }
      }
      if (pfVar11 == (float *)0x0) {
        lVar18 = *(long *)(lVar18 + 0x30);
        if (lVar18 == 0) {
          __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t1.c"
                        ,0x6b7,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
        }
        if (*(int *)(lVar42 + 0x14) == 1) {
          if (uVar27 != 0) {
            lVar18 = lVar18 + (long)iVar40 * (ulong)uVar35 * 4 + (long)iVar39 * 4;
            lVar42 = 0;
            uVar45 = 0;
            do {
              uVar46 = 0;
              iVar4 = (int)lVar42;
              if ((uVar32 & 0xfffffffc) != 0) {
                uVar46 = 0;
                do {
                  iVar39 = (int)uVar46;
                  fVar2 = pfVar28[(uint)(iVar4 + 3 + iVar39)];
                  fVar30 = pfVar28[(uint)(iVar4 + 2 + iVar39)];
                  fVar6 = pfVar28[iVar4 + iVar39 + 1];
                  piVar8 = (int *)(lVar18 + uVar46 * 4);
                  *piVar8 = (int)pfVar28[(uint)(iVar4 + iVar39)] / 2;
                  piVar8[1] = (int)fVar6 / 2;
                  piVar8[2] = (int)fVar30 / 2;
                  piVar8[3] = (int)fVar2 / 2;
                  uVar46 = uVar46 + 4;
                } while (uVar46 < (uVar32 & 0xfffffffc));
              }
              if ((uint)uVar46 < uVar32) {
                uVar46 = uVar46 & 0xffffffff;
                do {
                  *(int *)(lVar18 + uVar46 * 4) = (int)pfVar28[(uint)(iVar4 + (int)uVar46)] / 2;
                  uVar46 = uVar46 + 1;
                } while (uVar33 != uVar46);
              }
              uVar45 = uVar45 + 1;
              lVar18 = lVar18 + (ulong)uVar35 * 4;
              lVar42 = lVar42 + uVar33;
            } while (uVar45 != uVar27);
          }
        }
        else if (uVar27 != 0) {
          lVar18 = lVar18 + (long)iVar40 * (ulong)uVar35 * 4 + (long)iVar39 * 4;
          uVar52 = 0;
          do {
            if (uVar33 != 0) {
              lVar42 = 0;
              do {
                *(float *)(lVar18 + lVar42 * 4) = (float)(int)*pfVar28 * (float)piVar8[10];
                pfVar28 = pfVar28 + 1;
                lVar42 = lVar42 + 1;
              } while (uVar32 != (uint)lVar42);
            }
            uVar52 = uVar52 + 1;
            lVar18 = lVar18 + (ulong)uVar35 * 4;
          } while (uVar52 != uVar47);
        }
      }
      else {
        uVar32 = uVar32 * uVar47;
        if (*(int *)(lVar42 + 0x14) == 1) {
          if (uVar32 != 0) {
            uVar33 = 0;
            do {
              pfVar28[uVar33] = (float)((int)pfVar28[uVar33] / 2);
              uVar33 = uVar33 + 1;
            } while (uVar32 != uVar33);
          }
        }
        else {
          uVar35 = uVar32 & 0xfffffff0;
          if (uVar35 == 0) {
            uVar35 = 0;
          }
          else {
            fVar2 = (float)piVar8[10];
            uVar47 = 0;
            do {
              *pfVar28 = (float)(int)*pfVar28 * fVar2;
              pfVar28[1] = (float)(int)pfVar28[1] * fVar2;
              pfVar28[2] = (float)(int)pfVar28[2] * fVar2;
              pfVar28[3] = (float)(int)pfVar28[3] * fVar2;
              pfVar28[4] = (float)(int)pfVar28[4] * fVar2;
              pfVar28[5] = (float)(int)pfVar28[5] * fVar2;
              pfVar28[6] = (float)(int)pfVar28[6] * fVar2;
              pfVar28[7] = (float)(int)pfVar28[7] * fVar2;
              pfVar28[8] = (float)(int)pfVar28[8] * fVar2;
              pfVar28[9] = (float)(int)pfVar28[9] * fVar2;
              pfVar28[10] = (float)(int)pfVar28[10] * fVar2;
              pfVar28[0xb] = (float)(int)pfVar28[0xb] * fVar2;
              pfVar28[0xc] = (float)(int)pfVar28[0xc] * fVar2;
              pfVar28[0xd] = (float)(int)pfVar28[0xd] * fVar2;
              pfVar28[0xe] = (float)(int)pfVar28[0xe] * fVar2;
              pfVar28[0xf] = (float)(int)pfVar28[0xf] * fVar2;
              pfVar28 = pfVar28 + 0x10;
              uVar47 = uVar47 + 0x10;
            } while (uVar47 < uVar35);
          }
          if (uVar35 <= uVar32 && uVar32 - uVar35 != 0) {
            lVar18 = 0;
            do {
              pfVar28[lVar18] = (float)(int)pfVar28[lVar18] * (float)piVar8[10];
              lVar18 = lVar18 + 1;
            } while (uVar32 - uVar35 != (int)lVar18);
          }
        }
      }
      goto LAB_00124f5b;
    }
    if (mutex == (opj_mutex_t *)0x0) {
      opj_event_msg(p_event_mgr,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                    (ulong)uVar47);
    }
    else {
      opj_mutex_lock(mutex);
      opj_event_msg(p_event_mgr,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                    uVar33);
      opj_mutex_unlock(mutex);
    }
  }
LAB_00124f52:
  **(undefined4 **)((long)user_data + 0x30) = 0;
LAB_00124f5b:
  opj_free(user_data);
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper);
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if (OPJ_FALSE == opj_t1_decode_cblk(
                t1,
                cblk,
                band->bandno,
                (OPJ_UINT32)tccp->roishift,
                tccp->cblksty,
                job->p_manager,
                job->p_manager_mutex,
                job->check_pterm)) {
        *(job->pret) = OPJ_FALSE;
        opj_free(job);
        return;
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(band->stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * band->stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * band->stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}